

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O2

Pipeline * __thiscall
capnp::AnyPointer::Pipeline::getPointerField
          (Pipeline *__return_storage_ptr__,Pipeline *this,uint16_t pointerIndex)

{
  size_t sVar1;
  PipelineOp *pPVar2;
  unsigned_long i;
  size_t sVar3;
  size_t count;
  Array<capnp::PipelineOp> newOps;
  Array<capnp::PipelineOp> local_68;
  Own<capnp::PipelineHook,_std::nullptr_t> local_48;
  
  count = (this->ops).size_ + 1;
  pPVar2 = kj::_::HeapArrayDisposer::allocate<capnp::PipelineOp>(count);
  local_68.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  sVar1 = (this->ops).size_;
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    pPVar2[sVar3] = (this->ops).ptr[sVar3];
  }
  sVar1 = (this->ops).size_;
  pPVar2[sVar1].type = GET_POINTER_FIELD;
  pPVar2[sVar1].field_1.pointerIndex = pointerIndex;
  local_68.ptr = pPVar2;
  local_68.size_ = count;
  (**((this->hook).ptr)->_vptr_PipelineHook)(&local_48);
  (__return_storage_ptr__->hook).disposer = local_48.disposer;
  (__return_storage_ptr__->hook).ptr = local_48.ptr;
  local_48.ptr = (PipelineHook *)0x0;
  (__return_storage_ptr__->ops).ptr = pPVar2;
  (__return_storage_ptr__->ops).size_ = count;
  (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_68.ptr = (PipelineOp *)0x0;
  local_68.size_ = 0;
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose(&local_48);
  kj::Array<capnp::PipelineOp>::~Array(&local_68);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline AnyPointer::Pipeline::getPointerField(uint16_t pointerIndex) {
  auto newOps = kj::heapArray<PipelineOp>(ops.size() + 1);
  for (auto i: kj::indices(ops)) {
    newOps[i] = ops[i];
  }
  auto& newOp = newOps[ops.size()];
  newOp.type = PipelineOp::GET_POINTER_FIELD;
  newOp.pointerIndex = pointerIndex;

  return Pipeline(hook->addRef(), kj::mv(newOps));
}